

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faddeeva.c
# Opt level: O1

double xc_erfcx(double x)

{
  double dVar1;
  double dVar2;
  
  if (0.0 <= x) {
    if (x <= 50.0) {
      dVar2 = erfcx_y100(400.0 / (x + 4.0));
      return dVar2;
    }
    if (x <= 50000000.0) {
      dVar2 = x * x;
      dVar2 = (((dVar2 + 4.5) * dVar2 + 2.0) * 0.5641895835477563) /
              (x * ((dVar2 + 5.0) * dVar2 + 3.75));
    }
    else {
      dVar2 = 0.5641895835477563 / x;
    }
  }
  else if (-26.7 <= x) {
    dVar2 = exp(x * x);
    if (-6.1 <= x) {
      dVar1 = erfcx_y100(400.0 / (4.0 - x));
      dVar2 = (dVar2 + dVar2) - dVar1;
    }
    else {
      dVar2 = dVar2 + dVar2;
    }
  }
  else {
    dVar2 = INFINITY;
  }
  return dVar2;
}

Assistant:

GPU_FUNCTION
double xc_erfcx(double x)
{
  if (x >= 0) {
    if (x > 50) { // continued-fraction expansion is faster
      const double ispi = 0.56418958354775628694807945156; // 1 / sqrt(pi)
      if (x > 5e7) // 1-term expansion, important to avoid overflow
        return ispi / x;
      /* 5-term expansion (rely on compiler for CSE), simplified from:
                ispi / (x+0.5/(x+1/(x+1.5/(x+2/x))))  */
      return ispi*((x*x) * (x*x+4.5) + 2) / (x * ((x*x) * (x*x+5) + 3.75));
    }
    return erfcx_y100(400/(4+x));
  }
  else
    return x < -26.7 ? HUGE_VAL : (x < -6.1 ? 2*exp(x*x)
                                   : 2*exp(x*x) - erfcx_y100(400/(4-x)));
}